

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::AGGREGATE_STATE
                  (Value *__return_storage_ptr__,LogicalType *type,const_data_ptr_t data,idx_t len)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  StringValueInfo *pSVar1;
  ExtraValueInfo *__tmp;
  undefined1 local_69;
  StringValueInfo *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  LogicalType local_38;
  
  LogicalType::LogicalType(&local_38,type);
  Value(__return_storage_ptr__,&local_38);
  LogicalType::~LogicalType(&local_38);
  __return_storage_ptr__->is_null = false;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,data,data + len);
  local_68 = (StringValueInfo *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::StringValueInfo,std::allocator<duckdb::StringValueInfo>,std::__cxx11::string>
            (&local_60,&local_68,(allocator<duckdb::StringValueInfo> *)&local_69,&local_58);
  pSVar1 = local_68;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_60._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002dc418;
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
LAB_002dc418:
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pSVar1->super_ExtraValueInfo;
  this = (__return_storage_ptr__->value_info_).internal.
         super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_60._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::AGGREGATE_STATE(const LogicalType &type, const_data_ptr_t data, idx_t len) { // NOLINT
	Value result(type);
	result.is_null = false;
	result.value_info_ = make_shared_ptr<StringValueInfo>(string(const_char_ptr_cast(data), len));
	return result;
}